

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webpmux.c
# Opt level: O3

int main(int argc,char **argv)

{
  char cVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined8 uVar5;
  int i_3;
  int iVar6;
  int iVar7;
  FeatureType FVar8;
  WebPMuxError WVar9;
  undefined4 uVar10;
  uint32_t nth;
  WebPMuxError WVar11;
  void *pvVar12;
  WebPMux *pWVar13;
  int num_occurences_3;
  ActionType AVar14;
  int i_6;
  int iVar15;
  int num_occurences;
  uint uVar16;
  int iVar17;
  long lVar18;
  char *pcVar19;
  ulong uVar20;
  char *pcVar21;
  int i_5;
  int i_7;
  WebPMux *pWVar22;
  int i;
  uint uVar23;
  char **ppcVar24;
  long lVar25;
  bool bVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  uint32_t flag;
  FeatureType local_13c;
  WebPMux *mux;
  WebPMux *local_130;
  int dispose_method;
  uint local_124;
  char **local_120;
  WebPData chunk;
  undefined8 local_108;
  uint local_100;
  WebPChunkId local_fc;
  WebPMuxAnimDispose local_f8;
  WebPMuxAnimBlend local_f4;
  long local_e8;
  char plus_minus;
  undefined3 uStack_db;
  void *local_d8;
  int nFrames;
  undefined1 local_c8 [40];
  ActionType AStack_a0;
  undefined4 uStack_9c;
  char *local_98;
  char *pcStack_90;
  undefined1 local_88 [16];
  ulong local_78;
  char *local_68;
  int unused;
  int parse_error;
  uint uStack_54;
  int local_50;
  int local_48;
  
  local_88 = (undefined1  [16])0x0;
  local_98 = (char *)0x0;
  pcStack_90 = (char *)0x0;
  stack0xffffffffffffff58 = (undefined1  [16])0x0;
  local_c8._16_8_ = (uint8_t *)0x0;
  local_c8._24_8_ = 0;
  local_c8._0_16_ = (undefined1  [16])0x0;
  local_78 = 0;
  iVar6 = ExUtilInitCommandLineArguments(argc + -1,argv + 1,(CommandLineArguments *)local_c8);
  if (iVar6 != 0) {
    pWVar22 = (WebPMux *)(long)(int)local_c8._0_4_;
    if ((long)pWVar22 < 1) {
      uVar16 = 0;
      iVar17 = 0;
      uVar23 = 0;
      iVar15 = 0;
      iVar6 = local_c8._0_4_;
LAB_00102e6a:
      if ((iVar17 == 0) && (uVar16 + uVar23 != 0)) {
        main_cold_49();
      }
      else {
        if ((iVar17 == 0) || (iVar15 < 1)) {
          iVar7 = 1;
          if (iVar17 != 0) {
            iVar7 = uVar16 + uVar23 + iVar17;
          }
          if (0 < iVar15) {
            iVar7 = iVar15;
          }
          local_78 = CONCAT44(local_78._4_4_,iVar7);
          pvVar12 = calloc((long)iVar7,0x18);
          auVar2 = local_88;
          local_88._8_8_ = pvVar12;
          auVar3 = local_88;
          if (pvVar12 == (void *)0x0) {
            main_cold_47();
            goto LAB_001044f7;
          }
          if (0 < iVar6) {
            local_68 = local_98;
            iVar15 = 0;
            local_88._0_4_ = auVar2._0_4_;
            local_13c = local_88._0_4_;
            local_130 = (WebPMux *)((ulong)local_130 & 0xffffffff00000000);
            ppcVar24 = (char **)local_c8._8_8_;
            AVar14 = AStack_a0;
            local_d8 = pvVar12;
            local_88 = auVar3;
LAB_00102f03:
            local_120 = (char **)((long)pvVar12 + (long)(int)local_130 * 0x18);
            local_e8 = (long)iVar15;
            pcVar19 = ppcVar24[local_e8];
            if (*pcVar19 == '-') {
              iVar17 = strcmp(pcVar19,"-set");
              if (iVar17 == 0) {
                if (AVar14 != NIL_ACTION) {
                  main_cold_12();
                  goto LAB_001044f2;
                }
                AStack_a0 = 2;
                iVar15 = iVar15 + 1;
                AVar14 = ACTION_SET;
              }
              else {
                iVar17 = strcmp(pcVar19,"-duration");
                if (iVar17 == 0) {
                  iVar15 = iVar15 + 2;
                  if (iVar6 < iVar15) goto LAB_001034cf;
                  if ((AVar14 != ACTION_DURATION) && (AVar14 != NIL_ACTION)) {
                    main_cold_11();
                    goto LAB_001044f2;
                  }
                  AStack_a0 = 6;
                  if ((local_13c != NIL_FEATURE) && (local_13c != FEATURE_DURATION)) {
                    main_cold_10();
                    goto LAB_001044f2;
                  }
                  local_88._0_4_ = 5;
                  local_120[2] = ppcVar24[local_e8 + 1];
                  local_130 = (WebPMux *)CONCAT44(local_130._4_4_,(int)local_130 + 1);
                  AVar14 = ACTION_DURATION;
                  local_13c = FEATURE_DURATION;
                }
                else {
                  iVar17 = strcmp(pcVar19,"-get");
                  if (iVar17 != 0) {
                    iVar17 = strcmp(pcVar19,"-strip");
                    if (iVar17 == 0) {
                      if (AVar14 == NIL_ACTION) {
                        AStack_a0 = 3;
                        local_78 = local_78 & 0xffffffff00000000;
                        iVar15 = iVar15 + 1;
                        AVar14 = ACTION_STRIP;
                        goto LAB_00103449;
                      }
                      main_cold_8();
                      goto LAB_001044f2;
                    }
                    iVar17 = strcmp(pcVar19,"-frame");
                    if (iVar17 == 0) {
                      iVar15 = iVar15 + 3;
                      if (iVar6 < iVar15) goto LAB_001034cf;
                      if ((AVar14 & ~ACTION_SET) == NIL_ACTION) {
                        AStack_a0 = 2;
                        if ((local_13c & ~FEATURE_ANMF) == NIL_FEATURE) {
                          local_88._0_4_ = 4;
                          *(int *)local_120 = 1;
                          local_120[1] = ppcVar24[local_e8 + 1];
                          local_120[2] = ppcVar24[local_e8 + 2];
LAB_001033a1:
                          local_130 = (WebPMux *)CONCAT44(local_130._4_4_,(int)local_130 + 1);
                          AVar14 = ACTION_SET;
                          local_13c = FEATURE_ANMF;
                          goto LAB_00103449;
                        }
                        main_cold_6();
                      }
                      else {
                        main_cold_7();
                      }
                      goto LAB_001044f2;
                    }
                    iVar17 = strcmp(pcVar19,"-loop");
                    if ((iVar17 == 0) || (iVar17 = strcmp(pcVar19,"-bgcolor"), iVar17 == 0)) {
                      iVar15 = iVar15 + 2;
                      if (iVar6 < iVar15) goto LAB_001034cf;
                      if ((AVar14 & ~ACTION_SET) == NIL_ACTION) {
                        AStack_a0 = 2;
                        if ((local_13c & ~FEATURE_ANMF) == NIL_FEATURE) {
                          local_88._0_4_ = 4;
                          iVar17 = strcmp(pcVar19,"-loop");
                          *(uint *)local_120 = 3 - (uint)(iVar17 == 0);
                          local_120[2] = ppcVar24[local_e8 + 1];
                          goto LAB_001033a1;
                        }
                        main_cold_4();
                      }
                      else {
                        main_cold_5();
                      }
                      goto LAB_001044f2;
                    }
                    cVar1 = pcVar19[1];
                    local_120 = ppcVar24;
                    if (cVar1 != 'o') {
                      iVar17 = strcmp(pcVar19,"-info");
                      if (iVar17 != 0) {
                        if ((cVar1 != 'h') || (pcVar19[2] != '\0')) goto LAB_001042a7;
                        goto LAB_0010462b;
                      }
LAB_001033f1:
                      iVar15 = iVar15 + 2;
                      if (iVar6 < iVar15) goto LAB_001034cf;
                      if (iVar15 < iVar6) {
                        pcVar21 = "ERROR: Too many arguments for \'%s\'.\n";
                        goto LAB_001034e0;
                      }
                      if (AVar14 == NIL_ACTION) {
                        AStack_a0 = 4;
                        local_78 = local_78 & 0xffffffff00000000;
                        AVar14 = ACTION_INFO;
                        ppcVar24 = local_120;
                        local_68 = local_120[local_e8 + 1];
                        local_98 = local_120[local_e8 + 1];
                        goto LAB_00103449;
                      }
                      main_cold_3();
                      goto LAB_001044f2;
                    }
                    if (pcVar19[2] == '\0') {
                      iVar15 = iVar15 + 2;
                      if (iVar15 <= iVar6) {
                        pcStack_90 = ppcVar24[local_e8 + 1];
                        goto LAB_00103449;
                      }
                      goto LAB_001034cf;
                    }
                    iVar17 = strcmp(pcVar19,"-info");
                    if (iVar17 == 0) goto LAB_001033f1;
LAB_001042a7:
                    iVar17 = strcmp(pcVar19,"-help");
                    if (iVar17 == 0) {
LAB_0010462b:
                      PrintHelp();
LAB_0010465a:
                      DeleteConfig((Config *)local_c8);
                      exit(0);
                    }
                    iVar17 = strcmp(pcVar19,"-version");
                    if (iVar17 == 0) {
                      uVar16 = WebPGetMuxVersion();
                      printf("%d.%d.%d\n",(ulong)(uVar16 >> 0x10 & 0xff),(ulong)(uVar16 >> 8 & 0xff)
                             ,(ulong)(uVar16 & 0xff));
                      goto LAB_0010465a;
                    }
                    if ((cVar1 == '-') && (pcVar19[2] == '\0')) {
                      if (iVar15 < iVar6 + -1) {
                        if (local_68 != (char *)0x0) {
                          pcVar19 = local_120[iVar15 + 1];
                          pcVar21 = "ERROR at \'%s\': Multiple input files specified.\n";
                          goto LAB_001044b9;
                        }
                        local_98 = local_120[iVar15 + 1];
                      }
                      goto LAB_001034ea;
                    }
                    pcVar21 = "ERROR: Unknown option: \'%s\'.\n";
LAB_001044b9:
                    fprintf(_stderr,pcVar21,pcVar19);
                    goto LAB_001044f2;
                  }
                  if (AVar14 != NIL_ACTION) {
                    main_cold_9();
                    goto LAB_001044f2;
                  }
                  AStack_a0 = 1;
                  iVar15 = iVar15 + 1;
                  AVar14 = ACTION_GET;
                }
              }
            }
            else {
              if (AVar14 == NIL_ACTION) {
                main_cold_2();
                goto LAB_001044f2;
              }
              iVar17 = strcmp(pcVar19,"icc");
              if (iVar17 == 0) {
                FVar8 = FEATURE_ICCP;
                if (local_13c != NIL_FEATURE) {
LAB_00104200:
                  main_cold_1();
                  goto LAB_001044f2;
                }
LAB_00103104:
                local_88._0_4_ = FVar8;
                pvVar12 = local_d8;
                local_13c = FVar8;
                if (AVar14 == ACTION_SET) {
                  iVar15 = iVar15 + 2;
                  if (iVar6 < iVar15) goto LAB_001034cf;
                  local_120[1] = ppcVar24[local_e8 + 1];
                  local_130 = (WebPMux *)CONCAT44(local_130._4_4_,(int)local_130 + 1);
                  AVar14 = ACTION_SET;
                }
                else {
                  iVar15 = iVar15 + 1;
                }
              }
              else {
                iVar17 = strcmp(pcVar19,"exif");
                if ((iVar17 == 0) || (iVar7 = strcmp(pcVar19,"xmp"), iVar7 == 0)) {
                  if (local_13c != NIL_FEATURE) goto LAB_00104200;
                  FVar8 = FEATURE_XMP - (iVar17 == 0);
                  goto LAB_00103104;
                }
                iVar17 = strcmp(pcVar19,"frame");
                if ((AVar14 == ACTION_GET) && (iVar17 == 0)) {
                  iVar15 = iVar15 + 2;
                  if (iVar15 <= iVar6) {
                    local_88._0_4_ = 4;
                    local_120[2] = ppcVar24[local_e8 + 1];
                    local_130 = (WebPMux *)CONCAT44(local_130._4_4_,(int)local_130 + 1);
                    AVar14 = ACTION_GET;
                    local_13c = FEATURE_ANMF;
                    pvVar12 = local_d8;
                    goto LAB_00103449;
                  }
LAB_001034cf:
                  pcVar21 = "ERROR: Too few arguments for \'%s\'.\n";
LAB_001034e0:
                  fprintf(_stderr,pcVar21,pcVar19);
                  goto LAB_001034ea;
                }
                iVar17 = strcmp(pcVar19,"loop");
                if ((AVar14 == ACTION_SET) && (iVar17 == 0)) {
                  iVar15 = iVar15 + 2;
                  if (iVar6 < iVar15) goto LAB_001034cf;
                  local_88._0_4_ = 6;
                  local_120[2] = ppcVar24[local_e8 + 1];
                  local_130 = (WebPMux *)CONCAT44(local_130._4_4_,(int)local_130 + 1);
                  AVar14 = ACTION_SET;
                  local_13c = FEATURE_LOOP;
                  pvVar12 = local_d8;
                  goto LAB_00103449;
                }
                iVar17 = strcmp(pcVar19,"bgcolor");
                pvVar12 = local_d8;
                if ((AVar14 == ACTION_SET) && (iVar17 == 0)) {
                  iVar15 = iVar15 + 2;
                  if (iVar6 < iVar15) goto LAB_001034cf;
                  local_88._0_4_ = 7;
                  local_120[2] = ppcVar24[local_e8 + 1];
                  local_130 = (WebPMux *)CONCAT44(local_130._4_4_,(int)local_130 + 1);
                  AVar14 = ACTION_SET;
                  local_13c = FEATURE_BGCOLOR;
                }
                else {
                  if (local_68 != (char *)0x0) {
                    pcVar21 = "ERROR at \'%s\': Multiple input files specified.\n";
                    goto LAB_001044b9;
                  }
                  iVar15 = iVar15 + 1;
                  local_68 = pcVar19;
                  local_98 = pcVar19;
                }
              }
            }
LAB_00103449:
            if (iVar6 <= iVar15) goto LAB_001034ea;
            goto LAB_00102f03;
          }
LAB_001034ea:
          if (AStack_a0 == NIL_ACTION) {
            main_cold_45();
          }
          else if (AStack_a0 == ACTION_INFO || local_88._0_4_ != NIL_FEATURE) {
            if (local_98 == (char *)0x0) {
              if (AStack_a0 == ACTION_SET) {
                if (local_88._0_4_ == FEATURE_ANMF) goto LAB_00103534;
                main_cold_15();
              }
              else {
                main_cold_14();
              }
            }
            else {
LAB_00103534:
              if ((AStack_a0 == ACTION_INFO) || (pcStack_90 != (char *)0x0)) {
                mux = (WebPMux *)0x0;
                uVar16 = 1;
                switch(AStack_a0) {
                case ACTION_GET:
                  iVar6 = CreateMux(local_98,&mux);
                  pWVar22 = mux;
                  uVar16 = 0;
                  if (iVar6 != 0) {
                    if (local_88._0_4_ - FEATURE_EXIF < 3) {
                      WVar9 = WebPMuxGetChunk(mux,kFourccList[(uint)local_88._0_4_],&chunk);
                      if (WVar9 == WEBP_MUX_OK) {
                        uVar16 = WriteData(pcStack_90,&chunk);
                      }
                      else {
                        main_cold_39();
                      }
                    }
                    else if (local_88._0_4_ == FEATURE_ANMF) {
                      _parse_error = (WebPMuxAnimParams)((ulong)_parse_error & 0xffffffff00000000);
                      chunk.bytes = (uint8_t *)0x0;
                      chunk.size = 0;
                      nth = ExUtilGetInt(*(char **)(local_88._8_8_ + 0x10),10,&parse_error);
                      if ((int)nth < 0) {
                        main_cold_43();
                        goto LAB_00104532;
                      }
                      pWVar13 = (WebPMux *)0x0;
                      if (parse_error == 0) {
                        WVar11 = WebPMuxGetFrame(pWVar22,nth,(WebPMuxFrameInfo *)&chunk);
                        WVar9 = WEBP_MUX_NOT_FOUND;
                        if (local_fc == WEBP_CHUNK_ANMF) {
                          WVar9 = WVar11;
                        }
                        if (WVar11 != WEBP_MUX_OK) {
                          WVar9 = WVar11;
                        }
                        if (WVar9 == WEBP_MUX_OK) {
                          pWVar13 = WebPNewInternal(0x108);
                          if (pWVar13 == (WebPMux *)0x0) {
                            main_cold_42();
                            goto LAB_00104532;
                          }
                          WVar9 = WebPMuxSetImage(pWVar13,&chunk,1);
                          if (WVar9 == WEBP_MUX_OK) {
                            iVar6 = WriteWebP(pWVar13,pcStack_90);
                            bVar26 = iVar6 != 0;
                            goto LAB_00104537;
                          }
                          main_cold_41();
                        }
                        else {
                          main_cold_40();
LAB_00104532:
                          pWVar13 = (WebPMux *)0x0;
                        }
                        bVar26 = false;
                      }
                      else {
                        bVar26 = true;
                      }
LAB_00104537:
                      WebPFree(chunk.bytes);
                      chunk.bytes = (uint8_t *)0x0;
                      chunk.size = 0;
                      WebPMuxDelete(pWVar13);
                      uVar16 = (uint)(byte)(parse_error == 0 & bVar26);
                    }
                    else {
                      main_cold_44();
                    }
                  }
                  break;
                case ACTION_SET:
                  switch(local_88._0_4_) {
                  case 1:
                  case 2:
                  case 3:
                    iVar6 = CreateMux(local_98,&mux);
                    uVar16 = 0;
                    if (iVar6 != 0) {
                      iVar6 = ExUtilReadFileToWebPData(*(char **)(local_88._8_8_ + 8),&chunk);
                      pWVar22 = mux;
                      if (iVar6 != 0) {
                        WVar9 = WebPMuxSetChunk(mux,kFourccList[(uint)local_88._0_4_],&chunk,1);
                        WebPFree(chunk.bytes);
                        chunk.bytes = (uint8_t *)0x0;
                        chunk.size = 0;
                        if (WVar9 == WEBP_MUX_OK) goto LAB_001041f4;
                        main_cold_31();
                      }
                    }
                    goto switchD_00103577_caseD_5;
                  case 4:
                    parse_error = 0xffffffff;
                    uStack_54 = 0;
                    pWVar22 = WebPNewInternal(0x108);
                    mux = pWVar22;
                    if (pWVar22 == (WebPMux *)0x0) {
                      main_cold_37();
                    }
                    else {
                      if (0 < (int)local_78) {
                        lVar18 = 0x10;
                        lVar25 = 0;
                        do {
                          iVar6 = *(int *)(local_88._8_8_ + lVar18 + -0x10);
                          if (iVar6 == 1) {
                            local_fc = WEBP_CHUNK_ANMF;
                            iVar6 = ExUtilReadFileToWebPData
                                              (*(char **)(local_88._8_8_ + lVar18 + -8),&chunk);
                            if (iVar6 == 0) goto LAB_001045ea;
                            uVar10 = __isoc99_sscanf(*(undefined8 *)
                                                      ((long)(FeatureSubType *)local_88._8_8_ +
                                                      lVar18),"+%d+%d+%d+%d%c%c+%d",&local_100,
                                                     &local_108,(long)&local_108 + 4,&dispose_method
                                                     ,&plus_minus,&flag,&unused);
                            switch(uVar10) {
                            case 1:
                              local_108 = 0;
                              break;
                            default:
                              goto switchD_00103fc7_caseD_2;
                            case 3:
                              break;
                            case 4:
                              goto switchD_00103fc7_caseD_4;
                            case 6:
                              goto switchD_00103fc7_caseD_6;
                            }
                            dispose_method = 0;
switchD_00103fc7_caseD_4:
                            _plus_minus = CONCAT31(uStack_db,0x2b);
                            flag = CONCAT31(flag._1_3_,0x62);
switchD_00103fc7_caseD_6:
                            if (((local_108._4_4_ | (uint)local_108) & 1) != 0) {
                              fprintf(_stderr,
                                      "Warning: odd offsets will be snapped to even values (%d, %d) -> (%d, %d)\n"
                                      ,local_108 & 0xffffffff,(ulong)local_108._4_4_,
                                      (ulong)((uint)local_108 & 0xfffffffe),
                                      (ulong)(local_108._4_4_ & 0xfffffffe));
                            }
                            local_f8 = dispose_method;
                            if ((char)flag == 'b') {
                              if (((_plus_minus & 0xff) == 0x2b) || ((_plus_minus & 0xff) == 0x2d))
                              {
                                local_f4 = (WebPMuxAnimBlend)(plus_minus != '+');
                                WVar9 = WebPMuxPushFrame(pWVar22,(WebPMuxFrameInfo *)&chunk,1);
                                WebPFree(chunk.bytes);
                                chunk.bytes = (uint8_t *)0x0;
                                chunk.size = 0;
                                if (WVar9 == WEBP_MUX_OK) goto LAB_00104091;
                                main_cold_32();
                                goto LAB_001045ea;
                              }
                            }
switchD_00103fc7_caseD_2:
                            WebPFree(chunk.bytes);
                            chunk.bytes = (uint8_t *)0x0;
                            chunk.size = 0;
                            fwrite("ERROR: Could not parse frame properties.\n",0x29,1,_stderr);
                            goto LAB_001045ea;
                          }
                          if (iVar6 == 2) {
                            auVar2._12_4_ = 0;
                            auVar2._0_12_ = (undefined1  [12])chunk._4_12_;
                            chunk = (WebPData)(auVar2 << 0x20);
                            uVar16 = ExUtilGetInt(*(char **)((long)(FeatureSubType *)local_88._8_8_
                                                            + lVar18),10,(int *)&chunk);
                            if (0xffff < uVar16) {
                              main_cold_33();
                              goto LAB_001045ea;
                            }
                            if ((uint32_t)chunk.bytes != 0) goto LAB_001045ea;
                            uStack_54 = uVar16;
                          }
                          else {
                            if (iVar6 != 3) {
                              main_cold_36();
                              goto LAB_001045ea;
                            }
                            iVar6 = ParseBgcolorArgs(*(char **)((long)(FeatureSubType *)
                                                                      local_88._8_8_ + lVar18),
                                                     (uint32_t *)&chunk);
                            if (iVar6 == 0) {
                              main_cold_35();
                              goto LAB_001045ea;
                            }
                            parse_error = (uint32_t)chunk.bytes;
                          }
LAB_00104091:
                          lVar25 = lVar25 + 1;
                          lVar18 = lVar18 + 0x18;
                        } while (lVar25 < (int)local_78);
                      }
                      WVar9 = WebPMuxSetAnimationParams(pWVar22,(WebPMuxAnimParams *)&parse_error);
                      if (WVar9 == WEBP_MUX_OK) {
LAB_001041f4:
                        uVar16 = WriteWebP(pWVar22,pcStack_90);
                        goto switchD_00103577_caseD_5;
                      }
                      main_cold_34();
                    }
                    break;
                  default:
                    main_cold_38();
                    break;
                  case 6:
                    chunk.bytes = &DAT_ffffffff;
                    _parse_error = (WebPMuxAnimParams)((ulong)_parse_error & 0xffffffff00000000);
                    uVar16 = ExUtilGetInt(*(char **)(local_88._8_8_ + 0x10),10,&parse_error);
                    if ((uVar16 < 0x10000) && (parse_error == 0)) {
                      iVar6 = CreateMux(local_98,&mux);
                      pWVar22 = mux;
                      if (iVar6 != 0) {
                        WVar9 = WebPMuxGetAnimationParams(mux,(WebPMuxAnimParams *)&chunk);
                        if (WVar9 == WEBP_MUX_OK) {
                          chunk.bytes._4_4_ = uVar16;
                          WVar9 = WebPMuxSetAnimationParams(pWVar22,(WebPMuxAnimParams *)&chunk);
                          if (WVar9 == WEBP_MUX_OK) goto LAB_001041f4;
                          main_cold_29();
                        }
                        else {
                          main_cold_28();
                        }
                      }
                    }
                    else {
                      main_cold_30();
                    }
                    break;
                  case 7:
                    chunk.bytes = &DAT_ffffffff;
                    iVar6 = ParseBgcolorArgs(*(char **)(local_88._8_8_ + 0x10),
                                             (uint32_t *)&parse_error);
                    if (iVar6 == 0) {
                      main_cold_27();
                    }
                    else {
                      iVar6 = CreateMux(local_98,&mux);
                      pWVar22 = mux;
                      if (iVar6 != 0) {
                        WVar9 = WebPMuxGetAnimationParams(mux,(WebPMuxAnimParams *)&chunk);
                        if (WVar9 == WEBP_MUX_OK) {
                          chunk.bytes._0_4_ = parse_error;
                          WVar9 = WebPMuxSetAnimationParams(pWVar22,(WebPMuxAnimParams *)&chunk);
                          if (WVar9 == WEBP_MUX_OK) goto LAB_001041f4;
                          main_cold_26();
                        }
                        else {
                          main_cold_25();
                        }
                      }
                    }
                  }
LAB_001045ea:
                  uVar16 = 0;
                  break;
                case ACTION_STRIP:
                  iVar6 = CreateMux(local_98,&mux);
                  pWVar22 = mux;
                  uVar16 = 0;
                  if (iVar6 != 0) {
                    if (local_88._0_4_ - FEATURE_EXIF < 3) {
                      WVar9 = WebPMuxDeleteChunk(mux,kFourccList[(uint)local_88._0_4_]);
                      if (WVar9 == WEBP_MUX_OK) goto LAB_001041f4;
                      main_cold_20();
                    }
                    else {
                      main_cold_19();
                    }
                  }
                  break;
                case ACTION_INFO:
                  iVar6 = CreateMux(local_98,&mux);
                  pWVar22 = mux;
                  if (iVar6 == 0) goto LAB_001045ea;
                  WebPMuxGetCanvasSize(mux,&unused,(int *)&plus_minus);
                  uVar16 = 0;
                  printf("Canvas size: %d x %d\n",(ulong)(uint)unused,(ulong)_plus_minus);
                  WVar9 = WebPMuxGetFeatures(pWVar22,&flag);
                  if (WVar9 == WEBP_MUX_OK) {
                    if (flag == 0) {
                      puts("No features present.");
                      uVar16 = 1;
                    }
                    else {
                      printf("Features present:");
                      if ((flag & 2) != 0) {
                        printf(" animation");
                      }
                      if ((flag & 0x20) != 0) {
                        printf(" ICC profile");
                      }
                      if ((flag & 8) != 0) {
                        printf(" EXIF metadata");
                      }
                      if ((flag & 4) != 0) {
                        printf(" XMP metadata");
                      }
                      if ((flag & 0x10) != 0) {
                        printf(" transparency");
                      }
                      putchar(10);
                      if ((flag & 2) != 0) {
                        WebPMuxGetAnimationParams(pWVar22,(WebPMuxAnimParams *)&dispose_method);
                        printf("Background color : 0x%.8X  Loop Count : %d\n",
                               (ulong)(uint)dispose_method,(ulong)local_124);
                        WebPMuxNumChunks(pWVar22,WEBP_CHUNK_ANMF,&nFrames);
                        printf("Number of %ss: %d\n","frame",(ulong)(uint)nFrames);
                        if (0 < nFrames) {
                          printf("No.: width height alpha x_offset y_offset ");
                          printf("duration   dispose blend ");
                          puts("image_size  compression");
                          if (0 < nFrames) {
                            uVar23 = 1;
                            do {
                              WVar9 = WebPMuxGetFrame(pWVar22,uVar23,(WebPMuxFrameInfo *)&chunk);
                              if (WVar9 != WEBP_MUX_OK) {
                                WebPFree(chunk.bytes);
                                chunk.bytes = (uint8_t *)0x0;
                                chunk.size = 0;
                                uVar16 = 0;
                                fprintf(_stderr,"Failed to retrieve %s#%d\n","frame",(ulong)uVar23);
                                goto switchD_00103577_caseD_5;
                              }
                              WebPGetFeaturesInternal
                                        (chunk.bytes,chunk.size,
                                         (WebPBitstreamFeatures *)&parse_error,0x209);
                              pcVar19 = "yes";
                              if (local_50 == 0) {
                                pcVar19 = "no";
                              }
                              printf("%3d: %5d %5d %5s %8d %8d ",(ulong)uVar23,
                                     (ulong)_parse_error & 0xffffffff,(ulong)_parse_error >> 0x20,
                                     pcVar19,local_108 & 0xffffffff,local_108 >> 0x20);
                              pcVar19 = "background";
                              if (local_f8 == WEBP_MUX_DISPOSE_NONE) {
                                pcVar19 = "none";
                              }
                              pcVar21 = "no";
                              if (local_f4 == WEBP_MUX_BLEND) {
                                pcVar21 = "yes";
                              }
                              printf("%8d %10s %5s ",(ulong)local_100,pcVar19,pcVar21);
                              pcVar19 = "undefined";
                              if (local_48 == 2) {
                                pcVar19 = "lossless";
                              }
                              if (local_48 == 1) {
                                pcVar19 = "lossy";
                              }
                              printf("%10d %11s\n",(ulong)(uint)chunk.size,pcVar19);
                              WebPFree(chunk.bytes);
                              bVar26 = (int)uVar23 < nFrames;
                              uVar23 = uVar23 + 1;
                            } while (bVar26);
                          }
                        }
                      }
                      if ((flag & 0x20) != 0) {
                        WebPMuxGetChunk(pWVar22,"ICCP",&chunk);
                        printf("Size of the ICC profile data: %d\n",(ulong)(uint)chunk.size);
                      }
                      if ((flag & 8) != 0) {
                        WebPMuxGetChunk(pWVar22,"EXIF",&chunk);
                        printf("Size of the EXIF metadata: %d\n",(ulong)(uint)chunk.size);
                      }
                      if ((flag & 4) != 0) {
                        WebPMuxGetChunk(pWVar22,"XMP ",&chunk);
                        printf("Size of the XMP metadata: %d\n",(ulong)(uint)chunk.size);
                      }
                      uVar16 = 1;
                      if ((flag & 0x12) == 0x10) {
                        WVar9 = WebPMuxGetFrame(pWVar22,1,(WebPMuxFrameInfo *)&chunk);
                        if (WVar9 != WEBP_MUX_OK) {
                          main_cold_18();
                          goto LAB_001045ea;
                        }
                        printf("Size of the image (with alpha): %d\n",(ulong)(uint)chunk.size);
                        WebPFree(chunk.bytes);
                      }
                    }
                  }
                  else {
                    main_cold_17();
                  }
                  break;
                case ACTION_DURATION:
                  iVar6 = CreateMux(local_98,&mux);
                  uVar16 = 0;
                  if (iVar6 != 0) {
                    local_130 = mux;
                    WVar9 = WebPMuxNumChunks(mux,WEBP_CHUNK_ANMF,&dispose_method);
                    if (WVar9 != WEBP_MUX_OK) {
                      main_cold_21();
                      goto LAB_001045ea;
                    }
                    if (dispose_method == 0) {
                      fwrite("Doesn\'t look like the source is animated. Skipping duration setting.\n"
                             ,0x45,1,_stderr);
                      pWVar22 = local_130;
                      goto LAB_001041f4;
                    }
                    uVar16 = (uint)(WVar9 == WEBP_MUX_OK);
                    pWVar22 = WebPNewInternal(0x108);
                    if (pWVar22 != (WebPMux *)0x0) {
                      WVar9 = WebPMuxGetAnimationParams(local_130,(WebPMuxAnimParams *)&parse_error)
                      ;
                      if ((WVar9 == WEBP_MUX_OK) &&
                         (WVar9 = WebPMuxSetAnimationParams
                                            (pWVar22,(WebPMuxAnimParams *)&parse_error),
                         WVar9 != WEBP_MUX_OK)) {
                        main_cold_22();
                      }
                      else {
                        lVar18 = 1;
                        do {
                          pcVar19 = kFourccList[lVar18];
                          WVar9 = WebPMuxGetChunk(local_130,pcVar19,&chunk);
                          if (((WVar9 == WEBP_MUX_OK) && (chunk.size != 0)) &&
                             (WVar9 = WebPMuxSetChunk(pWVar22,pcVar19,&chunk,1),
                             WVar9 != WEBP_MUX_OK)) {
                            main_cold_23();
                            goto LAB_00104518;
                          }
                          lVar18 = lVar18 + 1;
                        } while (lVar18 != 4);
                        pvVar12 = WebPMalloc((long)dispose_method << 2);
                        if (pvVar12 == (void *)0x0) break;
                        if (0 < dispose_method) {
                          lVar18 = 0;
                          do {
                            *(undefined4 *)((long)pvVar12 + lVar18 * 4) = 0xffffffff;
                            lVar18 = lVar18 + 1;
                          } while (lVar18 < dispose_method);
                        }
                        pWVar13 = pWVar22;
                        if (0 < (int)local_78) {
                          lVar18 = 0;
                          do {
                            uVar16 = ExUtilGetInts(((FeatureArg *)(local_88._8_8_ + lVar18 * 0x18))
                                                   ->params_,10,3,(int *)&chunk);
                            auVar4 = _DAT_0012a030;
                            auVar3 = _DAT_0012a020;
                            auVar2 = _DAT_0012a010;
                            if ((int)uVar16 < 1) {
LAB_0010450b:
                              uVar16 = 0;
                              goto LAB_0010450d;
                            }
                            if ((int)(uint32_t)chunk.bytes < 0) {
                              main_cold_24();
                              goto LAB_0010450b;
                            }
                            iVar6 = dispose_method;
                            if (uVar16 == 1) {
                              iVar15 = 1;
                            }
                            else {
                              iVar15 = dispose_method;
                              if ((int)chunk.bytes._4_4_ < dispose_method) {
                                iVar15 = chunk.bytes._4_4_;
                              }
                              if ((int)chunk.bytes._4_4_ < 1) {
                                iVar15 = 1;
                              }
                              iVar17 = iVar15;
                              if (2 < uVar16) {
                                iVar17 = (uint)chunk.size;
                              }
                              if (iVar17 < dispose_method) {
                                iVar6 = iVar17;
                              }
                              if (iVar17 == 0) {
                                iVar6 = dispose_method;
                              }
                            }
                            uVar16 = iVar6 - iVar15;
                            if (iVar15 <= iVar6) {
                              auVar27._4_4_ = 0;
                              auVar27._0_4_ = uVar16;
                              auVar27._8_4_ = uVar16;
                              auVar27._12_4_ = 0;
                              auVar27 = auVar27 ^ _DAT_0012a030;
                              uVar20 = 0;
                              do {
                                auVar28._8_4_ = (int)uVar20;
                                auVar28._0_8_ = uVar20;
                                auVar28._12_4_ = (int)(uVar20 >> 0x20);
                                auVar29 = (auVar28 | auVar3) ^ auVar4;
                                iVar6 = auVar27._4_4_;
                                if ((bool)(~(iVar6 < auVar29._4_4_ ||
                                            auVar27._0_4_ < auVar29._0_4_ && auVar29._4_4_ == iVar6)
                                          & 1)) {
                                  *(uint32_t *)((long)pvVar12 + uVar20 * 4 + (long)iVar15 * 4 + -4)
                                       = (uint32_t)chunk.bytes;
                                }
                                if (auVar29._12_4_ <= auVar27._12_4_ &&
                                    (auVar29._8_4_ <= auVar27._8_4_ ||
                                    auVar29._12_4_ != auVar27._12_4_)) {
                                  *(uint32_t *)((long)pvVar12 + uVar20 * 4 + (long)iVar15 * 4) =
                                       (uint32_t)chunk.bytes;
                                }
                                auVar28 = (auVar28 | auVar2) ^ auVar4;
                                iVar17 = auVar28._4_4_;
                                if (iVar17 <= iVar6 &&
                                    (iVar17 != iVar6 || auVar28._0_4_ <= auVar27._0_4_)) {
                                  *(uint32_t *)((long)pvVar12 + uVar20 * 4 + (long)iVar15 * 4 + 4) =
                                       (uint32_t)chunk.bytes;
                                  *(uint32_t *)((long)pvVar12 + uVar20 * 4 + (long)iVar15 * 4 + 8) =
                                       (uint32_t)chunk.bytes;
                                }
                                uVar20 = uVar20 + 4;
                              } while (((ulong)uVar16 + 4 & 0xfffffffffffffffc) != uVar20);
                            }
                            lVar18 = lVar18 + 1;
                          } while (lVar18 < (int)local_78);
                        }
                        if (0 < dispose_method) {
                          lVar18 = 0;
                          pcVar19 = "ERROR: can not retrieve frame #%d.\n";
                          do {
                            WVar9 = WebPMuxGetFrame(local_130,(int)lVar18 + 1,
                                                    (WebPMuxFrameInfo *)&chunk);
                            if ((WVar9 != WEBP_MUX_OK) || (local_fc != WEBP_CHUNK_ANMF)) {
LAB_00104447:
                              uVar16 = 0;
                              fprintf(_stderr,pcVar19,(ulong)((int)lVar18 + 1));
                              goto LAB_0010450d;
                            }
                            uVar16 = *(uint *)((long)pvVar12 + lVar18 * 4);
                            if (-1 < (int)uVar16) {
                              local_100 = uVar16;
                            }
                            WVar9 = WebPMuxPushFrame(pWVar22,(WebPMuxFrameInfo *)&chunk,1);
                            if (WVar9 != WEBP_MUX_OK) {
                              pcVar19 = "ERROR: error push frame data #%d\n";
                              goto LAB_00104447;
                            }
                            WebPFree(chunk.bytes);
                            lVar18 = lVar18 + 1;
                          } while (lVar18 < dispose_method);
                        }
                        WebPMuxDelete(local_130);
                        uVar16 = WriteWebP(pWVar22,pcStack_90);
                        pWVar13 = (WebPMux *)0x0;
                        mux = pWVar22;
LAB_0010450d:
                        pWVar22 = pWVar13;
                        WebPFree(pvVar12);
                      }
LAB_00104518:
                      WebPMuxDelete(pWVar22);
                    }
                  }
                }
switchD_00103577_caseD_5:
                WebPMuxDelete(mux);
                uVar16 = (uint)(uVar16 == 0);
                goto LAB_001045fe;
              }
              main_cold_16();
            }
          }
          else {
            main_cold_13();
          }
LAB_001044f2:
          main_cold_46();
          goto LAB_001044f7;
        }
        main_cold_48();
      }
    }
    else {
      pWVar13 = (WebPMux *)0x0;
      uVar5 = local_c8._8_8_;
      uVar16 = 0;
      do {
        iVar6 = strcmp(*(char **)(uVar5 + pWVar13 * 8),"-get");
        uVar16 = uVar16 + (iVar6 == 0);
        pWVar13 = (WebPMux *)((long)&pWVar13->images_ + 1);
      } while (pWVar22 != pWVar13);
      if (uVar16 < 2) {
        pWVar13 = (WebPMux *)0x0;
        uVar16 = 0;
        do {
          iVar6 = strcmp(*(char **)(uVar5 + pWVar13 * 8),"-set");
          uVar16 = uVar16 + (iVar6 == 0);
          pWVar13 = (WebPMux *)((long)&pWVar13->images_ + 1);
        } while (pWVar22 != pWVar13);
        if (uVar16 < 2) {
          pWVar13 = (WebPMux *)0x0;
          uVar16 = 0;
          do {
            iVar6 = strcmp(*(char **)(uVar5 + pWVar13 * 8),"-strip");
            uVar16 = uVar16 + (iVar6 == 0);
            pWVar13 = (WebPMux *)((long)&pWVar13->images_ + 1);
          } while (pWVar22 != pWVar13);
          if (uVar16 < 2) {
            pWVar13 = (WebPMux *)0x0;
            uVar16 = 0;
            do {
              iVar6 = strcmp(*(char **)(uVar5 + pWVar13 * 8),"-info");
              uVar16 = uVar16 + (iVar6 == 0);
              pWVar13 = (WebPMux *)((long)&pWVar13->images_ + 1);
            } while (pWVar22 != pWVar13);
            if (uVar16 < 2) {
              pWVar13 = (WebPMux *)0x0;
              uVar16 = 0;
              do {
                pcVar19 = *(char **)(uVar5 + pWVar13 * 8);
                uVar23 = 0;
                if ((*pcVar19 == '-') && (pcVar19[1] == 'o')) {
                  uVar23 = (uint)(pcVar19[2] == '\0');
                }
                uVar16 = uVar16 + uVar23;
                pWVar13 = (WebPMux *)((long)&pWVar13->images_ + 1);
              } while (pWVar22 != pWVar13);
              if (uVar16 < 2) {
                pWVar13 = (WebPMux *)0x0;
                iVar17 = 0;
                do {
                  iVar6 = strcmp(*(char **)(uVar5 + pWVar13 * 8),"-frame");
                  iVar17 = iVar17 + (uint)(iVar6 == 0);
                  pWVar13 = (WebPMux *)((long)&pWVar13->images_ + 1);
                } while (pWVar22 != pWVar13);
                pWVar13 = (WebPMux *)0x0;
                uVar23 = 0;
                do {
                  iVar6 = strcmp(*(char **)(uVar5 + pWVar13 * 8),"-loop");
                  uVar23 = uVar23 + (iVar6 == 0);
                  pWVar13 = (WebPMux *)((long)&pWVar13->images_ + 1);
                } while (pWVar22 != pWVar13);
                pWVar13 = (WebPMux *)0x0;
                uVar16 = 0;
                do {
                  iVar6 = strcmp(*(char **)(uVar5 + pWVar13 * 8),"-bgcolor");
                  uVar16 = uVar16 + (iVar6 == 0);
                  pWVar13 = (WebPMux *)((long)&pWVar13->images_ + 1);
                } while (pWVar22 != pWVar13);
                pWVar13 = (WebPMux *)0x0;
                iVar15 = 0;
                local_130 = pWVar22;
                do {
                  iVar6 = strcmp(*(char **)(uVar5 + pWVar13 * 8),"-duration");
                  iVar15 = iVar15 + (uint)(iVar6 == 0);
                  pWVar13 = (WebPMux *)((long)&pWVar13->images_ + 1);
                } while (local_130 != pWVar13);
                if (uVar23 < 2) {
                  iVar6 = (int)local_130;
                  if (uVar16 < 2) goto LAB_00102e6a;
                  main_cold_50();
                }
                else {
                  main_cold_51();
                }
              }
              else {
                main_cold_52();
              }
            }
            else {
              main_cold_53();
            }
          }
          else {
            main_cold_54();
          }
        }
        else {
          main_cold_55();
        }
      }
      else {
        main_cold_56();
      }
    }
    main_cold_57();
  }
LAB_001044f7:
  PrintHelp();
  uVar16 = 1;
LAB_001045fe:
  free((void *)local_88._8_8_);
  ExUtilDeleteCommandLineArguments((CommandLineArguments *)local_c8);
  return uVar16;
}

Assistant:

int main(int argc, const char* argv[]) {
  Config config;
  int ok;

  INIT_WARGV(argc, argv);

  ok = InitializeConfig(argc - 1, argv + 1, &config, GET_WARGV_OR_NULL());
  if (ok) {
    ok = Process(&config);
  } else {
    PrintHelp();
  }
  DeleteConfig(&config);
  FREE_WARGV_AND_RETURN(!ok);
}